

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePath.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChLinePath::EraseSubLine(ChLinePath *this,size_t n)

{
  pointer *ppdVar1;
  
  std::
  vector<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ::erase(&this->lines,
          (this->lines).
          super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
          ._M_impl.super__Vector_impl_data._M_start + n);
  std::vector<double,_std::allocator<double>_>::erase
            (&this->durations,
             (const_iterator)
             ((this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + n));
  ppdVar1 = &(this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppdVar1 = *ppdVar1 + -1;
  if ((this->lines).
      super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->lines).
      super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    SetSubLineDurationN(this,0,*(this->durations).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
    return;
  }
  return;
}

Assistant:

void ChLinePath::EraseSubLine(size_t n) {
    lines.erase(lines.begin() + n);
    durations.erase(durations.begin() + n);
    end_times.pop_back();
    // force recompute all end times:
    if (lines.size())
        SetSubLineDurationN(0, durations[0]);
}